

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlatin1stringmatcher.h
# Opt level: O1

R_conflict10 __thiscall
QtPrivate::
q_boyer_moore_searcher_hashed_needle<char_const*,QtPrivate::QCaseSensitiveLatin1Hash,std::equal_to<void>>
::operator()(q_boyer_moore_searcher_hashed_needle<char_const*,QtPrivate::QCaseSensitiveLatin1Hash,std::equal_to<void>>
             *this,char *first,char *last,char *pat_first,char *pat_last)

{
  char *pcVar1;
  bool bVar2;
  char *pcVar3;
  char *pcVar4;
  byte *pbVar5;
  byte *pbVar6;
  byte *pbVar7;
  ulong uVar8;
  byte *pbVar9;
  ulong uVar10;
  char *pcVar11;
  ulong uVar12;
  R_conflict10 RVar13;
  
  uVar8 = (long)pat_last - (long)pat_first;
  pbVar5 = (byte *)first;
  pbVar7 = (byte *)first;
  if (uVar8 != 0) {
    pbVar9 = (byte *)(first + (uVar8 - 1));
    pbVar6 = (byte *)first;
    do {
      pbVar5 = (byte *)last;
      pbVar7 = (byte *)last;
      if (last <= pbVar9) break;
      uVar12 = (ulong)(byte)this[*pbVar9];
      if (uVar12 == 0) {
        if ((long)uVar8 < 1) {
          uVar10 = 0;
        }
        else {
          if (*pbVar9 == pat_first[uVar8 - 1]) {
            pcVar11 = (char *)0x0;
            do {
              uVar10 = uVar8;
              if (pat_first + (1 - (long)pat_last) == pcVar11) goto LAB_00177a85;
              pcVar4 = pcVar11 + -1;
              pcVar1 = pcVar11 + -1;
              pcVar3 = pcVar11 + -2;
              pcVar11 = pcVar1;
            } while (pbVar9[(long)pcVar4] == pat_last[(long)pcVar3]);
            uVar10 = -(long)pcVar1;
            bVar2 = (long)uVar10 < (long)uVar8;
          }
          else {
            uVar10 = 0;
            bVar2 = 0 < (long)uVar8;
          }
          if (bVar2) {
            uVar12 = uVar8 - uVar10;
            if (uVar8 != (byte)this[pbVar9[-uVar10]]) {
              uVar12 = 1;
            }
            goto LAB_00177a18;
          }
        }
LAB_00177a85:
        pbVar6 = pbVar9 + (uVar8 - uVar10) + 1;
        first = (char *)(pbVar9 + (1 - uVar10));
        bVar2 = false;
      }
      else {
LAB_00177a18:
        pbVar9 = pbVar9 + uVar12;
        bVar2 = true;
      }
      pbVar5 = (byte *)first;
      pbVar7 = pbVar6;
    } while (bVar2);
  }
  RVar13.end = (char *)pbVar7;
  RVar13.begin = (char *)pbVar5;
  return RVar13;
}

Assistant:

constexpr auto operator()(RandomIt2 first, RandomIt2 last, RandomIt1 pat_first,
                              RandomIt1 pat_last) const
    {
        struct R
        {
            RandomIt2 begin, end;
        };
        Hash hf;
        BinaryPredicate pred;
        auto pat_length = std::distance(pat_first, pat_last);
        if (pat_length == 0)
            return R{ first, first };

        const qsizetype pl_minus_one = qsizetype(pat_length - 1);
        RandomIt2 current = first + pl_minus_one;

        while (current < last) {
            qsizetype skip = m_skiptable[hf(*current)];
            if (!skip) {
                // possible match
                while (skip < pat_length) {
                    if (!pred(hf(*(current - skip)), uchar(pat_first[pl_minus_one - skip])))
                        break;
                    skip++;
                }
                if (skip > pl_minus_one) { // we have a match
                    auto match = current - skip + 1;
                    return R{ match, match + pat_length };
                }

                // If we don't have a match we are a bit inefficient as we only skip by one
                // when we have the non matching char in the string.
                if (m_skiptable[hf(*(current - skip))] == pat_length)
                    skip = pat_length - skip;
                else
                    skip = 1;
            }
            current += skip;
        }

        return R{ last, last };
    }